

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O1

void __thiscall
pbrt::KdTreeAggregate::buildTree
          (KdTreeAggregate *this,int nodeNum,Bounds3f *nodeBounds,
          vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_> *allPrimBounds,
          int *primNums,int nPrimitives,int depth,
          unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_> *edges,int *prims0,
          int *prims1,int badRefines)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  pointer pBVar5;
  float fVar6;
  anon_union_4_3_69f49728_for_KdAccelNode_0 aVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  float fVar12;
  float fVar13;
  KdAccelNode *__src;
  pointer pBVar14;
  BoundEdge *pBVar15;
  float fVar16;
  uint uVar17;
  KdAccelNode *pKVar18;
  EdgeType *pEVar19;
  Bounds3f *pBVar20;
  Point3<float> *pPVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar28;
  BoundEdge *__i;
  int iVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  pointer pBVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  undefined1 auVar51 [16];
  float fVar52;
  float fVar53;
  undefined1 in_XMM20 [16];
  uint local_16c;
  ulong local_158;
  Bounds3f bounds1;
  Bounds3f bounds0;
  
  bounds0.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)nodeNum;
  fVar12 = (float)this->nextFreeNode;
  bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar12;
  if (fVar12 != (float)nodeNum) {
    LogFatal<char_const(&)[8],char_const(&)[13],char_const(&)[8],int&,char_const(&)[13],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/aggregates.cpp"
               ,0x363,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [8])"nodeNum",
               (char (*) [13])"nextFreeNode",(char (*) [8])"nodeNum",(int *)&bounds0,
               (char (*) [13])"nextFreeNode",(int *)&bounds1);
  }
  fVar13 = (float)this->nAllocedNodes;
  if (fVar12 == fVar13) {
    uVar27 = 0x200;
    if (0x200 < (int)fVar13 * 2) {
      uVar27 = (ulong)(uint)((int)fVar13 * 2);
    }
    pKVar18 = (KdAccelNode *)operator_new__(uVar27 * 8);
    if (0 < (int)fVar13) {
      __src = this->nodes;
      memcpy(pKVar18,__src,(ulong)(uint)fVar13 << 3);
      if (__src != (KdAccelNode *)0x0) {
        operator_delete__(__src);
      }
    }
    this->nodes = pKVar18;
    this->nAllocedNodes = (int)uVar27;
  }
  this->nextFreeNode = this->nextFreeNode + 1;
  if ((depth != 0) && (this->maxPrims < nPrimitives)) {
    fVar12 = (float)nPrimitives * (float)this->isectCost;
    fVar13 = (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.x -
             (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
    pfVar1 = &(nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
    pfVar2 = &(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
    pfVar3 = &(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
    uVar8 = (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
    uVar10 = (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
    auVar43._4_4_ = uVar10;
    auVar43._0_4_ = uVar8;
    auVar43._8_8_ = 0;
    uVar9 = (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
    uVar11 = (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
    auVar41._4_4_ = uVar11;
    auVar41._0_4_ = uVar9;
    auVar41._8_8_ = 0;
    auVar44 = vsubps_avx(auVar43,auVar41);
    auVar43 = vmovshdup_avx(auVar44);
    auVar51 = ZEXT416((uint)fVar13);
    auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * auVar43._0_4_)),auVar44,auVar51);
    auVar40 = vfmadd231ss_fma(auVar40,auVar44,auVar43);
    auVar38 = vdivss_avx512f(SUB6416(ZEXT464(0x3f800000),0),
                             ZEXT416((uint)(auVar40._0_4_ + auVar40._0_4_)));
    auVar39 = vsubss_avx512f(ZEXT416((uint)(nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y),
                             auVar41);
    auVar40 = vmovshdup_avx(auVar41);
    auVar40 = vsubss_avx512f(ZEXT416((uint)(nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z),
                             auVar40);
    uVar27 = vcmpps_avx512vl(auVar44,auVar51,1);
    uVar26 = vcmpps_avx512vl(auVar43,auVar51,1);
    iVar23 = 0;
    uVar36 = (ulong)((auVar44._0_4_ <= auVar43._0_4_) + 1);
    if ((uVar27 & uVar26 & 1) != 0) {
      uVar36 = 0;
    }
    uVar17 = nPrimitives * 2;
    lVar24 = (long)(int)uVar17;
    uVar27 = 1;
    if (1 < (int)uVar17) {
      uVar27 = (ulong)uVar17;
    }
    pfVar4 = &(nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
    local_158 = 0xffffffff;
    local_16c = 0xffffffff;
    fVar52 = auVar39._0_4_;
    fVar53 = auVar40._0_4_;
    do {
      iVar28 = (int)uVar36;
      if (0 < nPrimitives) {
        pBVar14 = (allPrimBounds->
                  super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        pEVar19 = &edges[uVar36]._M_t.
                   super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                   .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl[1].type;
        uVar26 = 0;
        do {
          iVar25 = primNums[uVar26];
          pBVar5 = pBVar14 + iVar25;
          pBVar33 = pBVar5;
          if (iVar28 != 0) {
            if (iVar28 == 1) {
              pBVar33 = (pointer)&(pBVar5->pMin).super_Tuple3<pbrt::Point3,_float>.y;
            }
            else {
              pBVar33 = (pointer)&(pBVar5->pMin).super_Tuple3<pbrt::Point3,_float>.z;
            }
          }
          pEVar19[-5] = (EdgeType)(pBVar33->pMin).super_Tuple3<pbrt::Point3,_float>.x;
          pEVar19[-4] = iVar25;
          pEVar19[-3] = 0;
          if (iVar28 == 0) {
            pPVar21 = &pBVar5->pMax;
          }
          else if (iVar28 == 1) {
            pPVar21 = (Point3<float> *)&(pBVar5->pMax).super_Tuple3<pbrt::Point3,_float>.y;
          }
          else {
            pPVar21 = (Point3<float> *)&(pBVar5->pMax).super_Tuple3<pbrt::Point3,_float>.z;
          }
          ((BoundEdge *)(pEVar19 + -2))->t = (pPVar21->super_Tuple3<pbrt::Point3,_float>).x;
          pEVar19[-1] = iVar25;
          *pEVar19 = End;
          uVar26 = uVar26 + 1;
          pEVar19 = pEVar19 + 6;
        } while ((uint)nPrimitives != uVar26);
      }
      if (nPrimitives != 0) {
        pBVar15 = edges[uVar36]._M_t.
                  super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                  .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
        std::
        __introsort_loop<pbrt::BoundEdge*,long,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::KdTreeAggregate::buildTree(int,pbrt::Bounds3<float>const&,std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>const&,int*,int,int,std::unique_ptr<pbrt::BoundEdge[],std::default_delete<pbrt::BoundEdge[]>>const*,int*,int*,int)::__0>>
                  (pBVar15,pBVar15 + lVar24,(int)LZCOUNT(lVar24) * 2 ^ 0x7e);
        if (nPrimitives < 9) {
          std::
          __insertion_sort<pbrt::BoundEdge*,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::KdTreeAggregate::buildTree(int,pbrt::Bounds3<float>const&,std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>const&,int*,int,int,std::unique_ptr<pbrt::BoundEdge[],std::default_delete<pbrt::BoundEdge[]>>const*,int*,int*,int)::__0>>
                    ();
        }
        else {
          std::
          __insertion_sort<pbrt::BoundEdge*,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::KdTreeAggregate::buildTree(int,pbrt::Bounds3<float>const&,std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>const&,int*,int,int,std::unique_ptr<pbrt::BoundEdge[],std::default_delete<pbrt::BoundEdge[]>>const*,int*,int*,int)::__0>>
                    (pBVar15);
          lVar35 = lVar24 * 0xc + -0xc0;
          do {
            std::
            __unguarded_linear_insert<pbrt::BoundEdge*,__gnu_cxx::__ops::_Val_comp_iter<pbrt::KdTreeAggregate::buildTree(int,pbrt::Bounds3<float>const&,std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>const&,int*,int,int,std::unique_ptr<pbrt::BoundEdge[],std::default_delete<pbrt::BoundEdge[]>>const*,int*,int*,int)::__0>>
                      ();
            lVar35 = lVar35 + -0xc;
          } while (lVar35 != 0);
        }
      }
      iVar25 = nPrimitives;
      if (nPrimitives < 1) {
        iVar31 = 0;
      }
      else {
        iVar22 = iVar28 + 1 + ((iVar28 + 1U) / 3) * -3;
        iVar29 = iVar28 + 2 + ((iVar28 + 2U) / 3) * -3;
        fVar16 = 1.0 - this->emptyBonus;
        auVar43 = vcvtsi2ss_avx512f(in_XMM20,this->traversalCost);
        auVar40 = vcvtsi2ss_avx512f(in_XMM20,this->isectCost);
        pEVar19 = &(edges[uVar36]._M_t.
                    super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                    .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl)->type;
        uVar26 = 0;
        iVar31 = 0;
        do {
          pBVar20 = nodeBounds;
          if ((iVar28 != 0) && (pBVar20 = (Bounds3f *)pfVar2, iVar28 != 1)) {
            pBVar20 = (Bounds3f *)pfVar3;
          }
          iVar25 = iVar25 - (uint)(*pEVar19 == End);
          fVar6 = ((BoundEdge *)(pEVar19 + -2))->t;
          if ((pBVar20->pMin).super_Tuple3<pbrt::Point3,_float>.x < fVar6) {
            pPVar21 = &nodeBounds->pMax;
            if ((iVar28 != 0) && (pPVar21 = (Point3<float> *)pfVar1, iVar28 != 1)) {
              pPVar21 = (Point3<float> *)pfVar4;
            }
            if (fVar6 < (pPVar21->super_Tuple3<pbrt::Point3,_float>).x) {
              auVar39 = ZEXT416((uint)fVar52);
              auVar41 = ZEXT416((uint)fVar53);
              auVar44 = auVar51;
              if ((iVar22 != 0) && (auVar44 = auVar39, iVar22 != 1)) {
                auVar44 = auVar41;
              }
              auVar42 = auVar51;
              if ((iVar29 != 0) && (auVar42 = auVar39, iVar29 != 1)) {
                auVar42 = auVar41;
              }
              pBVar20 = nodeBounds;
              if ((iVar28 != 0) && (pBVar20 = (Bounds3f *)pfVar2, iVar28 != 1)) {
                pBVar20 = (Bounds3f *)pfVar3;
              }
              fVar45 = fVar13;
              if ((iVar22 != 0) && (fVar45 = fVar52, iVar22 != 1)) {
                fVar45 = fVar53;
              }
              fVar46 = fVar13;
              if ((iVar29 != 0) && (fVar46 = fVar52, iVar29 != 1)) {
                fVar46 = fVar53;
              }
              auVar47 = auVar51;
              if ((iVar22 != 0) && (auVar47 = auVar39, iVar22 != 1)) {
                auVar47 = auVar41;
              }
              auVar48 = auVar51;
              if ((iVar29 != 0) && (auVar48 = auVar39, iVar29 != 1)) {
                auVar48 = auVar41;
              }
              pPVar21 = &nodeBounds->pMax;
              if ((iVar28 != 0) && (pPVar21 = (Point3<float> *)pfVar1, iVar28 != 1)) {
                pPVar21 = (Point3<float> *)pfVar4;
              }
              fVar49 = fVar13;
              if ((iVar22 != 0) && (fVar49 = fVar52, iVar22 != 1)) {
                fVar49 = fVar53;
              }
              fVar50 = fVar13;
              if ((iVar29 != 0) && (fVar50 = fVar52, iVar29 != 1)) {
                fVar50 = fVar53;
              }
              auVar44 = vfmadd213ss_fma(auVar42,auVar44,
                                        ZEXT416((uint)((fVar6 - (pBVar20->pMin).
                                                                super_Tuple3<pbrt::Point3,_float>.x)
                                                      * (fVar45 + fVar46))));
              auVar39 = vfmadd213ss_fma(auVar48,auVar47,
                                        ZEXT416((uint)((fVar49 + fVar50) *
                                                      ((pPVar21->super_Tuple3<pbrt::Point3,_float>).
                                                       x - fVar6))));
              auVar41 = vmulss_avx512f(ZEXT416(auVar38._0_4_),
                                       ZEXT416((uint)(auVar44._0_4_ + auVar44._0_4_)));
              auVar42 = vmulss_avx512f(ZEXT416(auVar38._0_4_),
                                       ZEXT416((uint)(auVar39._0_4_ + auVar39._0_4_)));
              bVar37 = iVar31 == 0;
              auVar44 = vcvtsi2ss_avx512f(in_XMM20,iVar31);
              auVar39 = vcvtsi2ss_avx512f(in_XMM20,iVar25);
              auVar44 = vfmadd231ss_fma(ZEXT416((uint)(auVar42._0_4_ * auVar39._0_4_)),auVar41,
                                        auVar44);
              auVar39 = vfmadd213ss_fma(auVar44,ZEXT416((uint)((float)((uint)(iVar25 == 0) *
                                                                       (int)fVar16 +
                                                                      (uint)(iVar25 != 0) *
                                                                      ((uint)bVar37 * (int)fVar16 +
                                                                      (uint)!bVar37 * 0x3f800000)) *
                                                              auVar40._0_4_)),auVar43);
              auVar44 = vucomiss_avx512f(auVar39);
              vminss_avx512f(auVar39,auVar44);
              if (!bVar37) {
                local_158 = uVar26;
              }
              local_158 = local_158 & 0xffffffff;
              uVar34 = (ulong)local_16c;
              if (!bVar37) {
                uVar34 = uVar36;
              }
              local_16c = (uint)uVar34;
            }
          }
          iVar31 = iVar31 + (uint)(*pEVar19 == Start);
          uVar26 = uVar26 + 1;
          pEVar19 = pEVar19 + 3;
        } while (uVar27 != uVar26);
      }
      if ((iVar31 != nPrimitives) || (iVar25 != 0)) {
        LogFatal<char_const(&)[37]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/aggregates.cpp"
                   ,0x3b4,"Check failed: %s",(char (*) [37])"nBelow == nPrimitives && nAbove == 0");
      }
      bVar37 = iVar23 < 2;
      if (bVar37 && local_16c == 0xffffffff) {
        iVar23 = iVar23 + 1;
        uVar36 = (ulong)((iVar28 + 1U) % 3);
      }
      else {
        vucomiss_avx512f(ZEXT416((uint)fVar12));
        vucomiss_avx512f(ZEXT416((uint)(fVar12 * 4.0)));
        if (((nPrimitives < 0x10 && badRefines != 0) || (local_16c == 0xffffffff)) ||
           (badRefines == 3)) {
          KdAccelNode::InitLeaf(this->nodes + nodeNum,primNums,nPrimitives,&this->primitiveIndices);
        }
        else {
          iVar28 = 0;
          lVar35 = (long)(int)local_16c;
          iVar25 = 0;
          if (0 < (int)local_158) {
            pBVar15 = edges[lVar35]._M_t.
                      super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                      .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
            lVar30 = 0;
            iVar25 = 0;
            do {
              if (*(int *)((long)&pBVar15->type + lVar30) == 0) {
                lVar32 = (long)iVar25;
                iVar25 = iVar25 + 1;
                prims0[lVar32] = *(int *)((long)&pBVar15->primNum + lVar30);
              }
              lVar30 = lVar30 + 0xc;
            } while (local_158 * 0xc != lVar30);
          }
          if ((int)local_158 + 1 < (int)uVar17) {
            pEVar19 = &edges[lVar35]._M_t.
                       super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                       .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl
                       [(int)local_158 + 1].type;
            iVar31 = nPrimitives * -2 + 1 + (int)local_158;
            iVar28 = 0;
            do {
              if (*pEVar19 == End) {
                lVar30 = (long)iVar28;
                iVar28 = iVar28 + 1;
                prims1[lVar30] = pEVar19[-1];
              }
              pEVar19 = pEVar19 + 3;
              iVar31 = iVar31 + 1;
            } while (iVar31 != 0);
          }
          aVar7 = *(anon_union_4_3_69f49728_for_KdAccelNode_0 *)
                   (edges[lVar35]._M_t.
                    super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                    .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl + (int)local_158);
          bounds0.pMax.super_Tuple3<pbrt::Point3,_float>.y =
               (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
          bounds0.pMax.super_Tuple3<pbrt::Point3,_float>.z =
               (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
          bounds0.pMin.super_Tuple3<pbrt::Point3,_float>.x =
               (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
          bounds0.pMin.super_Tuple3<pbrt::Point3,_float>.y =
               (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
          bounds0._8_8_ = *(undefined8 *)&(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
          bounds1.pMax.super_Tuple3<pbrt::Point3,_float>.y =
               (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
          bounds1.pMax.super_Tuple3<pbrt::Point3,_float>.z =
               (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
          bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.x =
               (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
          bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.y =
               (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
          bounds1._8_8_ = *(undefined8 *)&(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
          pBVar20 = &bounds1;
          if ((local_16c != 0) &&
             (pBVar20 = (Bounds3f *)&bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.y,
             local_16c != 1)) {
            pBVar20 = (Bounds3f *)&bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.z;
          }
          (pBVar20->pMin).super_Tuple3<pbrt::Point3,_float>.x = (float)aVar7;
          pPVar21 = &bounds0.pMax;
          if ((local_16c != 0) &&
             (pPVar21 = (Point3<float> *)&bounds0.pMax.super_Tuple3<pbrt::Point3,_float>.y,
             local_16c != 1)) {
            pPVar21 = (Point3<float> *)&bounds0.pMax.super_Tuple3<pbrt::Point3,_float>.z;
          }
          (pPVar21->super_Tuple3<pbrt::Point3,_float>).x = (float)aVar7;
          buildTree(this,nodeNum + 1,&bounds0,allPrimBounds,prims0,iVar25,depth + -1,edges,prims0,
                    prims1 + nPrimitives,badRefines);
          iVar25 = this->nextFreeNode;
          pKVar18 = this->nodes;
          pKVar18[nodeNum].field_0 = aVar7;
          pKVar18[nodeNum].field_1.flags = iVar25 * 4 | local_16c;
          buildTree(this,iVar25,&bounds1,allPrimBounds,prims1,iVar28,depth + -1,edges,prims0,
                    prims1 + nPrimitives,badRefines);
        }
      }
    } while (bVar37 && local_16c == 0xffffffff);
    return;
  }
  KdAccelNode::InitLeaf(this->nodes + nodeNum,primNums,nPrimitives,&this->primitiveIndices);
  return;
}

Assistant:

void KdTreeAggregate::buildTree(int nodeNum, const Bounds3f &nodeBounds,
                                const std::vector<Bounds3f> &allPrimBounds, int *primNums,
                                int nPrimitives, int depth,
                                const std::unique_ptr<BoundEdge[]> edges[3], int *prims0,
                                int *prims1, int badRefines) {
    CHECK_EQ(nodeNum, nextFreeNode);
    // Get next free node from _nodes_ array
    if (nextFreeNode == nAllocedNodes) {
        int nNewAllocNodes = std::max(2 * nAllocedNodes, 512);
        KdAccelNode *n = new KdAccelNode[nNewAllocNodes];
        if (nAllocedNodes > 0) {
            memcpy(n, nodes, nAllocedNodes * sizeof(KdAccelNode));
            delete[] nodes;
        }
        nodes = n;
        nAllocedNodes = nNewAllocNodes;
    }
    ++nextFreeNode;

    // Initialize leaf node if termination criteria met
    if (nPrimitives <= maxPrims || depth == 0) {
        nodes[nodeNum].InitLeaf(primNums, nPrimitives, &primitiveIndices);
        return;
    }

    // Initialize interior node and continue recursion
    // Choose split axis position for interior node
    int bestAxis = -1, bestOffset = -1;
    Float bestCost = Infinity;
    Float oldCost = isectCost * Float(nPrimitives);
    Float totalSA = nodeBounds.SurfaceArea();
    Float invTotalSA = 1 / totalSA;
    Vector3f d = nodeBounds.pMax - nodeBounds.pMin;
    // Choose which axis to split along
    int axis = nodeBounds.MaxDimension();

    int retries = 0;
retrySplit:
    // Initialize edges for _axis_
    for (int i = 0; i < nPrimitives; ++i) {
        int pn = primNums[i];
        const Bounds3f &bounds = allPrimBounds[pn];
        edges[axis][2 * i] = BoundEdge(bounds.pMin[axis], pn, true);
        edges[axis][2 * i + 1] = BoundEdge(bounds.pMax[axis], pn, false);
    }
    // Sort _edges_ for _axis_
    std::sort(&edges[axis][0], &edges[axis][2 * nPrimitives],
              [](const BoundEdge &e0, const BoundEdge &e1) -> bool {
                  if (e0.t == e1.t)
                      return (int)e0.type < (int)e1.type;
                  else
                      return e0.t < e1.t;
              });

    // Compute cost of all splits for _axis_ to find best
    int nBelow = 0, nAbove = nPrimitives;
    for (int i = 0; i < 2 * nPrimitives; ++i) {
        if (edges[axis][i].type == EdgeType::End)
            --nAbove;
        Float edgeT = edges[axis][i].t;
        if (edgeT > nodeBounds.pMin[axis] && edgeT < nodeBounds.pMax[axis]) {
            // Compute cost for split at _i_th edge
            // Compute child surface areas for split at _edgeT_
            int otherAxis0 = (axis + 1) % 3, otherAxis1 = (axis + 2) % 3;
            Float belowSA =
                2 * (d[otherAxis0] * d[otherAxis1] +
                     (edgeT - nodeBounds.pMin[axis]) * (d[otherAxis0] + d[otherAxis1]));
            Float aboveSA =
                2 * (d[otherAxis0] * d[otherAxis1] +
                     (nodeBounds.pMax[axis] - edgeT) * (d[otherAxis0] + d[otherAxis1]));

            Float pBelow = belowSA * invTotalSA;
            Float pAbove = aboveSA * invTotalSA;
            Float eb = (nAbove == 0 || nBelow == 0) ? emptyBonus : 0;
            Float cost = traversalCost +
                         isectCost * (1 - eb) * (pBelow * nBelow + pAbove * nAbove);
            // Update best split if this is lowest cost so far
            if (cost < bestCost) {
                bestCost = cost;
                bestAxis = axis;
                bestOffset = i;
            }
        }
        if (edges[axis][i].type == EdgeType::Start)
            ++nBelow;
    }
    CHECK(nBelow == nPrimitives && nAbove == 0);

    // Create leaf if no good splits were found
    if (bestAxis == -1 && retries < 2) {
        ++retries;
        axis = (axis + 1) % 3;
        goto retrySplit;
    }
    if (bestCost > oldCost)
        ++badRefines;
    if ((bestCost > 4 * oldCost && nPrimitives < 16) || bestAxis == -1 ||
        badRefines == 3) {
        nodes[nodeNum].InitLeaf(primNums, nPrimitives, &primitiveIndices);
        return;
    }

    // Classify primitives with respect to split
    int n0 = 0, n1 = 0;
    for (int i = 0; i < bestOffset; ++i)
        if (edges[bestAxis][i].type == EdgeType::Start)
            prims0[n0++] = edges[bestAxis][i].primNum;
    for (int i = bestOffset + 1; i < 2 * nPrimitives; ++i)
        if (edges[bestAxis][i].type == EdgeType::End)
            prims1[n1++] = edges[bestAxis][i].primNum;

    // Recursively initialize children nodes
    Float tSplit = edges[bestAxis][bestOffset].t;
    Bounds3f bounds0 = nodeBounds, bounds1 = nodeBounds;
    bounds0.pMax[bestAxis] = bounds1.pMin[bestAxis] = tSplit;
    buildTree(nodeNum + 1, bounds0, allPrimBounds, prims0, n0, depth - 1, edges, prims0,
              prims1 + nPrimitives, badRefines);
    int aboveChild = nextFreeNode;
    nodes[nodeNum].InitInterior(bestAxis, aboveChild, tSplit);
    buildTree(aboveChild, bounds1, allPrimBounds, prims1, n1, depth - 1, edges, prims0,
              prims1 + nPrimitives, badRefines);
}